

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

TEdge * ClipperLib::FindNextLocMin(TEdge *E)

{
  TEdge *pTVar1;
  bool bVar2;
  bool local_19;
  TEdge *E2;
  TEdge *E_local;
  
  E2 = E;
  while( true ) {
    while( true ) {
      bVar2 = operator!=(&E2->Bot,&E2->Prev->Bot);
      local_19 = true;
      if (!bVar2) {
        local_19 = operator==(&E2->Curr,&E2->Top);
      }
      if (local_19 == false) break;
      E2 = E2->Next;
    }
    bVar2 = IsHorizontal(E2);
    if ((!bVar2) && (bVar2 = IsHorizontal(E2->Prev), !bVar2)) break;
    while (pTVar1 = E2, bVar2 = IsHorizontal(E2->Prev), bVar2) {
      E2 = E2->Prev;
    }
    while (bVar2 = IsHorizontal(E2), bVar2) {
      E2 = E2->Next;
    }
    if ((E2->Top).Y != (E2->Prev->Bot).Y) {
      if ((pTVar1->Prev->Bot).X < (E2->Bot).X) {
        E2 = pTVar1;
      }
      return E2;
    }
  }
  return E2;
}

Assistant:

TEdge* FindNextLocMin(TEdge* E)
{
  for (;;)
  {
    while (E->Bot != E->Prev->Bot || E->Curr == E->Top) E = E->Next;
    if (!IsHorizontal(*E) && !IsHorizontal(*E->Prev)) break;
    while (IsHorizontal(*E->Prev)) E = E->Prev;
    TEdge* E2 = E;
    while (IsHorizontal(*E)) E = E->Next;
    if (E->Top.Y == E->Prev->Bot.Y) continue; //ie just an intermediate horz.
    if (E2->Prev->Bot.X < E->Bot.X) E = E2;
    break;
  }
  return E;
}